

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr6r700sixx.cpp
# Opt level: O2

bool __thiscall
IKSolver::ComputeIk(IKSolver *this,IkReal *eetrans,IkReal *eerot,IkReal *pfree,
                   IkSolutionListBase<double> *solutions)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined4 extraout_EAX;
  int iVar3;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined8 extraout_RAX;
  undefined4 extraout_var;
  bool bVar4;
  int ij2;
  long lVar5;
  int ij0;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  ulong extraout_XMM0_Qb;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  double dVar34;
  double dVar35;
  double dVar36;
  CheckValue<double> CVar37;
  CheckValue<double> CVar38;
  undefined2 local_194;
  undefined2 local_192;
  double local_190;
  double local_188;
  ulong uStack_180;
  double local_170;
  uint local_164;
  double local_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  undefined8 uStack_130;
  IkReal j2array [2];
  IkReal j0array [2];
  IkReal sj2array [2];
  IkReal cj2array [2];
  IkReal sj0array [2];
  IkReal cj0array [2];
  
  this->j0 = NAN;
  this->j1 = NAN;
  this->j2 = NAN;
  this->j3 = NAN;
  this->j4 = NAN;
  this->j5 = NAN;
  this->_ij0[0] = 0xff;
  this->_ij0[1] = 0xff;
  this->_nj0 = 0xff;
  this->_ij1[0] = 0xff;
  *(undefined4 *)(this->_ij1 + 1) = 0xffffffff;
  this->_nj2 = 0xff;
  this->_ij3[0] = 0xff;
  this->_ij3[1] = 0xff;
  this->_nj3 = 0xff;
  this->_ij4[0] = 0xff;
  this->_ij4[1] = 0xff;
  this->_nj4 = 0xff;
  this->_ij5[0] = 0xff;
  *(undefined2 *)(this->_ij5 + 1) = 0xffff;
  (*solutions->_vptr_IkSolutionListBase[5])(solutions);
  dVar11 = *eerot;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar11;
  this->r00 = dVar11;
  local_190 = eerot[1];
  this->r01 = local_190;
  dVar9 = eerot[2];
  this->r02 = dVar9;
  local_158 = eerot[3];
  this->r10 = local_158;
  local_188 = eerot[4];
  this->r11 = local_188;
  uStack_180 = 0;
  dVar10 = eerot[5];
  this->r12 = dVar10;
  dVar8 = eerot[6];
  this->r20 = dVar8;
  dVar13 = eerot[7];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar13;
  this->r21 = dVar13;
  dVar12 = eerot[8];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar12;
  this->r22 = dVar12;
  dVar25 = *eetrans;
  this->px = dVar25;
  local_148 = eetrans[1];
  uStack_140 = 0;
  this->py = local_148;
  dVar26 = eetrans[2];
  this->new_r00 = dVar9;
  this->new_r01 = local_190;
  auVar22 = _DAT_00133070;
  auVar14 = auVar14 ^ _DAT_00133070;
  auVar20._0_8_ = auVar14._0_8_;
  auVar20._8_4_ = auVar14._0_4_;
  auVar20._12_4_ = auVar14._4_4_;
  this->new_r02 = auVar20._0_8_;
  this->r02 = (IkReal)auVar20._8_8_;
  this->new_r10 = -dVar10;
  this->r10 = -dVar10;
  this->new_r11 = -local_188;
  this->r11 = -local_188;
  this->new_r12 = local_158;
  auVar33 = auVar33 ^ auVar22;
  auVar21._0_8_ = auVar33._0_8_;
  auVar21._8_4_ = auVar33._0_4_;
  auVar21._12_4_ = auVar33._4_4_;
  this->new_r20 = auVar21._0_8_;
  this->r20 = (IkReal)auVar21._8_8_;
  auVar29 = auVar29 ^ auVar22;
  auVar22._0_8_ = auVar29._0_8_;
  auVar22._8_4_ = auVar29._0_4_;
  auVar22._12_4_ = auVar29._4_4_;
  this->new_r21 = auVar22._0_8_;
  this->r21 = (IkReal)auVar22._8_8_;
  uStack_150 = 0;
  dVar30 = dVar8 * 0.08 + (0.4 - dVar26);
  dVar25 = dVar11 * -0.08 + dVar25;
  dVar26 = local_148 * -1.0 + local_158 * 0.08;
  this->new_r22 = dVar8;
  this->new_pz = dVar30;
  this->r00 = dVar9;
  this->r01 = local_190;
  this->r12 = local_158;
  this->r22 = dVar8;
  this->pz = dVar30;
  this->new_px = dVar25;
  this->px = dVar25;
  this->new_py = dVar26;
  this->py = dVar26;
  this->npx = (dVar25 * dVar9 - dVar26 * dVar10) - dVar30 * dVar12;
  this->npy = (dVar25 * local_190 - dVar26 * local_188) - dVar30 * dVar13;
  this->npz = auVar20._0_8_ * dVar25 + local_158 * dVar26 + dVar8 * dVar30;
  this->pp = dVar25 * dVar25 + dVar26 * dVar26 + dVar30 * dVar30;
  this->rxp0_0 = dVar12 * dVar26 - dVar30 * dVar10;
  this->rxp0_1 = auVar21._0_8_ * dVar25 - dVar30 * dVar9;
  this->rxp0_2 = dVar10 * dVar25 + dVar9 * dVar26;
  this->rxp1_0 = dVar13 * dVar26 - dVar30 * local_188;
  this->rxp1_1 = auVar22._0_8_ * dVar25 - dVar30 * local_190;
  this->rxp1_2 = local_188 * dVar25 + local_190 * dVar26;
  this->rxp2_0 = dVar30 * local_158 - dVar26 * dVar8;
  this->rxp2_1 = dVar8 * dVar25 + dVar11 * dVar30;
  this->rxp2_2 = -local_158 * dVar25 - dVar11 * dVar26;
  if (ABS(ABS(dVar26) + ABS(dVar25)) < 1e-06) goto LAB_00118611;
  local_192 = 1;
  this->_nj0 = '\x02';
  CVar37 = IKatan2WithCheck<double>(dVar26,-dVar25,1e-07);
  dVar11 = CVar37.value;
  if (((undefined1  [16])CVar37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
  goto LAB_00118611;
  local_188 = -dVar11;
  uStack_180 = extraout_XMM0_Qb ^ 0x8000000000000000;
  j0array[0] = local_188;
  dVar8 = sin(local_188);
  sj0array[0] = dVar8;
  dVar9 = cos(local_188);
  local_188 = 3.14159265358979 - dVar11;
  j0array[1] = local_188;
  cj0array[0] = dVar9;
  local_190 = sin(local_188);
  sj0array[1] = local_190;
  dVar10 = cos(local_188);
  cj0array[1] = dVar10;
  if (-3.14159265358979 <= dVar11) {
    if (3.14159265358979 < dVar11) {
      dVar13 = 6.28318530717959;
      goto LAB_00116cfe;
    }
  }
  else {
    dVar13 = -6.28318530717959;
LAB_00116cfe:
    j0array[0] = dVar13 - dVar11;
  }
  if (local_188 <= 3.14159265358979) {
    if (local_188 < -3.14159265358979) {
      dVar11 = 6.28318530717959;
      goto LAB_00116d3b;
    }
  }
  else {
    dVar11 = -6.28318530717959;
LAB_00116d3b:
    j0array[1] = local_188 + dVar11;
  }
  local_192 = CONCAT11(1,(undefined1)local_192);
  dVar8 = dVar8 - local_190;
  local_164 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    if (*(char *)((long)&local_192 + lVar6) == '\x01') {
      this->_ij0[0] = (uchar)lVar6;
      this->_ij0[1] = 0xff;
      if ((((lVar6 == 0) && (ABS(dVar9 - dVar10) < 1e-06)) && ((local_164 & 1) != 0)) &&
         (ABS(dVar8) < 1e-06)) {
        local_192 = local_192 & 0xff;
        this->_ij0[1] = '\x01';
        local_164 = 0;
      }
      this->j0 = j0array[lVar6];
      dVar11 = cj0array[lVar6];
      this->cj0 = dVar11;
      dVar13 = sj0array[lVar6];
      this->sj0 = dVar13;
      local_194 = 1;
      this->_nj2 = '\x02';
      dVar11 = this->pp * -4.328914889538 +
               this->py * 0.2164457444769 * dVar13 +
               dVar11 * 0.2164457444769 * this->px + 1.00885361500683;
      if (ABS(dVar11) <= 1.0000001) {
        dVar12 = IKasin(dVar11);
        local_188 = -1.47519820813106 - dVar12;
        j2array[0] = local_188;
        dVar11 = sin(local_188);
        sj2array[0] = dVar11;
        dVar13 = cos(local_188);
        dVar12 = dVar12 + 1.66639444545874;
        j2array[1] = dVar12;
        cj2array[0] = dVar13;
        local_190 = sin(dVar12);
        sj2array[1] = local_190;
        dVar25 = cos(dVar12);
        cj2array[1] = dVar25;
        if (local_188 <= 3.14159265358979) {
          if (local_188 < -3.14159265358979) {
            j2array[0] = local_188 + 6.28318530717959;
            goto LAB_00116f7a;
          }
        }
        else {
          j2array[0] = local_188 + -6.28318530717959;
LAB_00116f7a:
        }
        dVar26 = -6.28318530717959;
        if ((3.14159265358979 < dVar12) || (dVar26 = 6.28318530717959, dVar12 < -3.14159265358979))
        {
          j2array[1] = dVar12 + dVar26;
        }
        local_194 = CONCAT11(1,(undefined1)local_194);
        dVar11 = dVar11 - local_190;
        bVar4 = true;
        for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
          if (*(char *)((long)&local_194 + lVar5) != '\x01') goto LAB_0011812e;
          this->_ij2[0] = (uchar)lVar5;
          this->_ij2[1] = 0xff;
          if (((lVar5 == 0) && (ABS(dVar13 - dVar25) < 1e-06)) && ((bVar4 && (ABS(dVar11) < 1e-06)))
             ) {
            local_194 = local_194 & 0xff;
            this->_ij2[1] = '\x01';
            bVar4 = false;
          }
          this->j2 = j2array[lVar5];
          dVar12 = cj2array[lVar5];
          this->cj2 = dVar12;
          local_190 = sj2array[lVar5];
          this->sj2 = local_190;
          local_148 = dVar12 * dVar12;
          dVar26 = this->pz;
          dVar34 = dVar12 * dVar26;
          dVar30 = this->cj0;
          dVar16 = this->px;
          dVar31 = dVar30 * dVar16;
          local_158 = dVar12 * local_190;
          dVar19 = this->py;
          dVar35 = this->sj0 * dVar19;
          local_138 = local_190 * dVar26;
          dVar15 = local_190 * 0.365;
          dVar24 = dVar12 * 0.035;
          dVar18 = -dVar35;
          dVar28 = -dVar31;
          local_170 = dVar26 * dVar26;
          if (1e-06 <= ABS(local_190 * 417.142857142857 * dVar35 +
                           ((local_138 * 40.0 +
                            ((dVar34 * 417.142857142857 +
                             local_190 * -10.4285714285714 +
                             dVar31 * local_190 * 417.142857142857 + dVar26 * 360.0 + dVar12) -
                            dVar35 * dVar12 * 40.0)) - dVar12 * 40.0 * dVar31))) {
            dVar23 = local_158 * 0.02555 + local_148 * 0.132 + -0.133225 + local_170;
            if (ABS(ABS(dVar26 * -0.025 +
                        local_190 * 0.114975 +
                        local_148 * -0.02555 + dVar12 * -0.011025 + local_158 * 0.132 + 0.012775 +
                        dVar26 * dVar35 + dVar26 * dVar31) + ABS(dVar23)) < 1e-06)
            goto LAB_00117258;
            local_188 = dVar15 * dVar35;
            if (dVar12 * 0.000875 +
                dVar34 * 0.365 +
                dVar26 * 0.315 +
                local_190 * -0.009125 + local_138 * 0.035 + dVar31 * dVar15 + dVar18 * dVar24 +
                local_188 + dVar28 * dVar24 == 0.0) goto LAB_00117258;
            this->_nj1 = '\x01';
            CVar37 = IKatan2WithCheck<double>
                               (dVar23,dVar26 * -0.025 +
                                       local_190 * 0.114975 +
                                       dVar12 * -0.011025 +
                                       local_158 * 0.132 +
                                       dVar26 * dVar31 +
                                       dVar26 * dVar35 + local_148 * -0.02555 + 0.012775,1e-07);
            if (((undefined1  [16])CVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              dVar12 = this->pz;
              dVar12 = dVar28 * dVar24 +
                       this->cj2 * 0.000875 +
                       this->cj2 * 0.365 * dVar12 +
                       dVar12 * 0.035 * this->sj2 +
                       local_188 +
                       dVar31 * dVar15 + dVar12 * 0.315 + this->sj2 * -0.009125 + dVar18 * dVar24;
              uVar7 = -(ulong)(0.0 < dVar12);
              local_190 = CVar37.value;
              CVar37 = IKPowWithIntegerCheck<double>
                                 ((double)(uVar7 & 0x3ff0000000000000 |
                                          ~uVar7 & -(ulong)(dVar12 < 0.0) & 0xbff0000000000000),-1);
              if (((undefined1  [16])CVar37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
              goto LAB_0011812e;
              dVar12 = CVar37.value * 1.5707963267949 + local_190 + -1.5707963267949;
              local_188 = sin(dVar12);
              dVar26 = cos(dVar12);
              if (dVar12 <= 3.14159265358979) {
                if (dVar12 < -3.14159265358979) {
                  dVar12 = dVar12 + 6.28318530717959;
                }
              }
              else {
                dVar12 = dVar12 + -6.28318530717959;
              }
              this->_ij1[0] = '\0';
              this->_ij1[1] = 0xff;
              this->j1 = dVar12;
              this->cj1 = dVar26;
              this->sj1 = local_188;
              dVar26 = sin(dVar12);
              dVar30 = cos(this->j1);
              dVar19 = this->py * this->sj0;
              dVar12 = this->pz;
              dVar16 = this->cj2 * 0.035;
              dVar24 = this->sj2 * 0.365;
              dVar28 = this->px * this->cj0;
              if (1e-05 < ABS((((dVar26 * -0.025 + dVar26 * dVar28 + dVar26 * dVar19) - dVar16) +
                              dVar24) - dVar30 * dVar12)) goto LAB_0011812e;
              dVar15 = this->cj2 * 0.365;
              dVar18 = this->sj2 * 0.035;
              auVar17._4_4_ =
                   -(uint)(1e-05 < ABS(dVar12 * -1.0 +
                                       dVar30 * dVar24 +
                                       dVar15 * dVar26 + dVar26 * 0.315 + dVar26 * dVar18 +
                                       dVar16 * -dVar30));
              auVar17._0_4_ =
                   -(uint)(1e-05 < ABS(((dVar30 * 0.025 + (0.315 - dVar19 * dVar30)) -
                                       dVar28 * dVar30) + dVar15 + dVar18 + dVar12 * -dVar26));
              auVar17._8_4_ =
                   -(uint)(1e-05 < ABS(dVar28 * dVar30 * 0.63 +
                                       dVar28 * 0.05 +
                                       dVar19 * 0.05 +
                                       this->pp * -1.0 +
                                       dVar30 * 0.63 * dVar19 + dVar30 * -0.01575 + 0.0346 +
                                       dVar26 * dVar12 * 0.63));
              auVar17._12_4_ =
                   -(uint)(1e-05 < ABS(dVar30 * dVar18 +
                                       ((dVar30 * 0.315 +
                                        dVar26 * dVar16 + ((0.025 - dVar19) - dVar28)) -
                                       dVar24 * dVar26) + dVar15 * dVar30));
              iVar3 = movmskps(extraout_EAX_00,auVar17);
joined_r0x00118307:
              if (iVar3 == 0) {
                rotationfunction0(this,solutions);
              }
            }
          }
          else {
LAB_00117258:
            dVar23 = dVar12 * 0.365;
            dVar27 = dVar12 * 0.009125 + 0.007875;
            local_160 = dVar18 * dVar23;
            dVar36 = dVar31 * -0.315;
            dVar32 = dVar35 * -0.315;
            uStack_130 = 0x8000000000000000;
            if ((ABS(local_190 * -40.0 * dVar31 +
                     dVar12 * 417.142857142857 * dVar18 +
                     dVar34 * -40.0 +
                     local_190 * dVar35 * -40.0 +
                     dVar12 * 10.4285714285714 +
                     dVar28 * dVar12 * 417.142857142857 +
                     local_138 * 417.142857142857 + dVar31 * -360.0 + dVar35 * -360.0 + 9.0 +
                     local_190) < 1e-06) ||
               (local_190 * -0.035 * dVar31 +
                local_190 * 0.000875 +
                local_138 * 0.365 +
                local_190 * dVar35 * -0.035 + dVar34 * -0.035 + dVar28 * dVar23 + dVar27 + local_160
                + dVar36 + dVar32 == 0.0)) {
              uStack_150 = 0;
              dVar30 = dVar30 * dVar30;
              dVar19 = dVar19 * dVar19;
              dVar12 = dVar16 * dVar16 * dVar30;
              local_188 = dVar34;
              local_158 = dVar36;
              local_148 = dVar23;
              local_138 = dVar18;
              if (1e-06 <= ABS((dVar31 * -3200.0 * dVar35 +
                               dVar12 * -1600.0 +
                               local_170 * -1600.0 +
                               dVar35 * 80.0 + dVar31 * 80.0 + dVar30 * dVar19 * 1600.0 + -1.0) -
                               dVar19 * 1600.0)) {
                dVar26 = dVar31 * 0.05 + dVar35 * 0.05 + -0.000625;
                if (((((dVar31 * -2.0 * dVar35 + dVar26) - dVar12) - local_170) - dVar19) +
                    dVar30 * dVar19 != 0.0) {
                  uStack_180 = 0x8000000000000000;
                  this->_nj1 = '\x01';
                  dVar12 = ((dVar35 * -2.0 * dVar31 + dVar30 * dVar19 + (dVar26 - dVar12)) - dVar19)
                           - local_170;
                  uVar7 = -(ulong)(0.0 < dVar12);
                  local_188 = dVar28;
                  CVar37 = IKPowWithIntegerCheck<double>
                                     ((double)(uVar7 & 0x3ff0000000000000 |
                                              ~uVar7 & -(ulong)(dVar12 < 0.0) & 0xbff0000000000000),
                                      -1);
                  if (((undefined1  [16])CVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    dVar26 = local_190 * 0.035;
                    dVar12 = this->pz;
                    local_170 = CVar37.value;
                    CVar37 = IKatan2WithCheck<double>
                                       (this->cj2 * 0.000875 +
                                        (((dVar15 * dVar31 +
                                          dVar12 * -0.315 +
                                          local_138 * dVar24 +
                                          local_188 * dVar24 +
                                          this->sj2 * -0.009125 + dVar35 * dVar15) -
                                         dVar12 * local_148) - dVar12 * dVar26),
                                        (local_158 +
                                        ((dVar32 + this->sj2 * 0.000875 +
                                                   local_138 * dVar26 +
                                                   local_160 +
                                                   dVar12 * dVar24 +
                                                   ((this->cj2 * 0.009125 + 0.007875) -
                                                   dVar12 * dVar15)) - local_148 * dVar31)) -
                                        dVar26 * dVar31,1e-07);
                    if (((undefined1  [16])CVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                    {
                      local_170 = local_170 * 1.5707963267949 + -1.5707963267949 + CVar37.value;
                      dVar12 = sin(local_170);
                      dVar26 = cos(local_170);
                      if (local_170 <= 3.14159265358979) {
                        dVar30 = local_170;
                        if (local_170 < -3.14159265358979) {
                          dVar30 = local_170 + 6.28318530717959;
                        }
                      }
                      else {
                        dVar30 = local_170 + -6.28318530717959;
                      }
                      this->_ij1[0] = '\0';
                      this->_ij1[1] = 0xff;
                      this->j1 = dVar30;
                      this->cj1 = dVar26;
                      this->sj1 = dVar12;
                      dVar30 = sin(dVar30);
                      dVar16 = cos(this->j1);
                      dVar24 = this->sj2 * 0.365;
                      dVar19 = this->py * this->sj0;
                      dVar12 = this->pz;
                      dVar28 = this->cj2 * 0.035;
                      dVar26 = this->cj0 * this->px;
                      if (ABS((dVar30 * -0.025 + ((dVar19 * dVar30 + dVar30 * dVar26) - dVar28) +
                              dVar24) - dVar12 * dVar16) <= 1e-05) {
                        dVar15 = this->sj2 * 0.035;
                        dVar18 = this->cj2 * 0.365;
                        auVar2._4_4_ = -(uint)(1e-05 < ABS(dVar15 * dVar30 +
                                                           dVar18 * dVar30 +
                                                           dVar30 * 0.315 +
                                                           ((dVar24 * dVar16 - dVar28 * dVar16) -
                                                           dVar12)));
                        auVar2._0_4_ = -(uint)(1e-05 < ABS(dVar16 * -dVar26 +
                                                           -dVar12 * dVar30 +
                                                           dVar16 * 0.025 +
                                                           (0.315 - dVar16 * dVar19) + dVar15 +
                                                           dVar18));
                        auVar2._8_4_ = -(uint)(1e-05 < ABS(dVar19 * 0.05 +
                                                           dVar26 * 0.05 +
                                                           dVar16 * dVar19 * 0.63 +
                                                           dVar12 * 0.63 * dVar30 +
                                                           dVar16 * -0.01575 +
                                                           this->pp * -1.0 +
                                                           dVar16 * dVar26 * 0.63 + 0.0346));
                        auVar2._12_4_ =
                             -(uint)(1e-05 < ABS(dVar19 * -1.0 +
                                                 dVar26 * -1.0 +
                                                 dVar16 * 0.315 +
                                                 dVar28 * dVar30 +
                                                 dVar15 * dVar16 +
                                                 dVar18 * dVar16 + dVar24 * -dVar30 + 0.025));
                        iVar3 = movmskps(extraout_EAX_01,auVar2);
                        goto joined_r0x00118307;
                      }
                    }
                  }
                }
              }
            }
            else {
              uStack_180 = 0x8000000000000000;
              dVar36 = dVar36 + dVar32 + local_190 * 0.000875 +
                                         dVar26 * 0.365 * local_190 +
                                         ((local_160 +
                                          dVar18 * local_190 * 0.035 +
                                          ((dVar12 * -0.035 * dVar26 + dVar27) - dVar23 * dVar31)) -
                                         local_190 * 0.035 * dVar31);
              uVar7 = -(ulong)(0.0 < dVar36);
              this->_nj1 = '\x01';
              local_188 = dVar28;
              local_160 = dVar26;
              local_138 = dVar18;
              CVar37 = IKPowWithIntegerCheck<double>
                                 ((double)(uVar7 & 0x3ff0000000000000 |
                                          ~uVar7 & -(ulong)(dVar36 < 0.0) & 0xbff0000000000000),-1);
              if (((undefined1  [16])CVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                dVar12 = this->pz;
                CVar38 = IKatan2WithCheck<double>
                                   (this->sj2 * 0.114975 +
                                    local_158 * 0.132 +
                                    local_188 * local_160 +
                                    this->cj2 * -0.011025 +
                                    local_148 * -0.02555 +
                                    local_138 * local_160 + dVar12 * 0.025 + 0.012775,
                                    this->cj2 * -0.22995 +
                                    local_148 * -0.132 +
                                    this->sj2 * -0.02205 +
                                    local_158 * -0.02555 + dVar12 * dVar12 + -0.10045,1e-07);
                if (((undefined1  [16])CVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  dVar12 = CVar37.value * 1.5707963267949 + -1.5707963267949 + CVar38.value;
                  local_188 = sin(dVar12);
                  dVar26 = cos(dVar12);
                  if (dVar12 <= 3.14159265358979) {
                    if (dVar12 < -3.14159265358979) {
                      dVar12 = dVar12 + 6.28318530717959;
                    }
                  }
                  else {
                    dVar12 = dVar12 + -6.28318530717959;
                  }
                  this->_ij1[0] = '\0';
                  this->_ij1[1] = 0xff;
                  this->j1 = dVar12;
                  this->cj1 = dVar26;
                  this->sj1 = local_188;
                  dVar26 = sin(dVar12);
                  dVar30 = cos(this->j1);
                  dVar24 = this->sj2 * 0.365;
                  dVar19 = this->py * this->sj0;
                  dVar12 = this->pz;
                  dVar16 = this->cj2 * 0.035;
                  dVar28 = this->cj0 * this->px;
                  if (ABS((dVar26 * -0.025 + ((dVar26 * dVar28 + dVar26 * dVar19) - dVar16) + dVar24
                          ) - dVar30 * dVar12) <= 1e-05) {
                    dVar15 = this->cj2 * 0.365;
                    dVar18 = this->sj2 * 0.035;
                    auVar1._4_4_ = -(uint)(1e-05 < ABS(dVar16 * -dVar30 +
                                                       dVar26 * 0.315 +
                                                       dVar15 * dVar26 +
                                                       dVar24 * dVar30 + dVar18 * dVar26 + -dVar12))
                    ;
                    auVar1._0_4_ = -(uint)(1e-05 < ABS(((((dVar30 * 0.025 + 0.315) - dVar19 * dVar30
                                                         ) - dVar26 * dVar12) - dVar30 * dVar28) +
                                                       dVar15 + dVar18));
                    auVar1._8_4_ = -(uint)(1e-05 < ABS(dVar30 * -0.01575 +
                                                       dVar30 * dVar28 * 0.63 +
                                                       this->pp * -1.0 +
                                                       dVar26 * dVar12 * 0.63 +
                                                       dVar19 * 0.05 +
                                                       dVar28 * 0.05 +
                                                       dVar30 * 0.63 * dVar19 + 0.0346));
                    auVar1._12_4_ =
                         -(uint)(1e-05 < ABS(dVar30 * dVar15 +
                                             dVar30 * 0.315 +
                                             ((((dVar30 * dVar18 + dVar26 * dVar16 + 0.025) -
                                               dVar26 * dVar24) - dVar19) - dVar28)));
                    iVar3 = movmskps(extraout_EAX,auVar1);
                    goto joined_r0x00118307;
                  }
                }
              }
            }
          }
LAB_0011812e:
        }
      }
    }
  }
LAB_00118611:
  iVar3 = (*solutions->_vptr_IkSolutionListBase[4])(solutions);
  return CONCAT44(extraout_var,iVar3) != 0;
}

Assistant:

bool ComputeIk(const IkReal* eetrans, const IkReal* eerot, const IkReal* pfree, IkSolutionListBase<IkReal>& solutions) {
j0=numeric_limits<IkReal>::quiet_NaN(); _ij0[0] = -1; _ij0[1] = -1; _nj0 = -1; j1=numeric_limits<IkReal>::quiet_NaN(); _ij1[0] = -1; _ij1[1] = -1; _nj1 = -1; j2=numeric_limits<IkReal>::quiet_NaN(); _ij2[0] = -1; _ij2[1] = -1; _nj2 = -1; j3=numeric_limits<IkReal>::quiet_NaN(); _ij3[0] = -1; _ij3[1] = -1; _nj3 = -1; j4=numeric_limits<IkReal>::quiet_NaN(); _ij4[0] = -1; _ij4[1] = -1; _nj4 = -1; j5=numeric_limits<IkReal>::quiet_NaN(); _ij5[0] = -1; _ij5[1] = -1; _nj5 = -1; 
for(int dummyiter = 0; dummyiter < 1; ++dummyiter) {
    solutions.Clear();
r00 = eerot[0*3+0];
r01 = eerot[0*3+1];
r02 = eerot[0*3+2];
r10 = eerot[1*3+0];
r11 = eerot[1*3+1];
r12 = eerot[1*3+2];
r20 = eerot[2*3+0];
r21 = eerot[2*3+1];
r22 = eerot[2*3+2];
px = eetrans[0]; py = eetrans[1]; pz = eetrans[2];

new_r00=r02;
new_r01=r01;
new_r02=((-1.0)*r00);
new_px=((((-0.08)*r00))+px);
new_r10=((-1.0)*r12);
new_r11=((-1.0)*r11);
new_r12=r10;
new_py=((((-1.0)*py))+(((0.08)*r10)));
new_r20=((-1.0)*r22);
new_r21=((-1.0)*r21);
new_r22=r20;
new_pz=((0.4)+(((-1.0)*pz))+(((0.08)*r20)));
r00 = new_r00; r01 = new_r01; r02 = new_r02; r10 = new_r10; r11 = new_r11; r12 = new_r12; r20 = new_r20; r21 = new_r21; r22 = new_r22; px = new_px; py = new_py; pz = new_pz;
IkReal x54=((1.0)*px);
IkReal x55=((1.0)*pz);
IkReal x56=((1.0)*py);
pp=((px*px)+(py*py)+(pz*pz));
npx=(((px*r00))+((py*r10))+((pz*r20)));
npy=(((px*r01))+((py*r11))+((pz*r21)));
npz=(((px*r02))+((py*r12))+((pz*r22)));
rxp0_0=((((-1.0)*r20*x56))+((pz*r10)));
rxp0_1=(((px*r20))+(((-1.0)*r00*x55)));
rxp0_2=((((-1.0)*r10*x54))+((py*r00)));
rxp1_0=((((-1.0)*r21*x56))+((pz*r11)));
rxp1_1=(((px*r21))+(((-1.0)*r01*x55)));
rxp1_2=((((-1.0)*r11*x54))+((py*r01)));
rxp2_0=(((pz*r12))+(((-1.0)*r22*x56)));
rxp2_1=(((px*r22))+(((-1.0)*r02*x55)));
rxp2_2=((((-1.0)*r12*x54))+((py*r02)));
{
IkReal j0eval[1];
j0eval[0]=((IKabs(px))+(IKabs(py)));
if( IKabs(j0eval[0]) < 0.0000010000000000  )
{
continue; // no branches [j0, j1, j2]

} else
{
{
IkReal j0array[2], cj0array[2], sj0array[2];
bool j0valid[2]={false};
_nj0 = 2;
CheckValue<IkReal> x58 = IKatan2WithCheck(IkReal(py),IkReal(((-1.0)*px)),IKFAST_ATAN2_MAGTHRESH);
if(!x58.valid){
continue;
}
IkReal x57=x58.value;
j0array[0]=((-1.0)*x57);
sj0array[0]=IKsin(j0array[0]);
cj0array[0]=IKcos(j0array[0]);
j0array[1]=((3.14159265358979)+(((-1.0)*x57)));
sj0array[1]=IKsin(j0array[1]);
cj0array[1]=IKcos(j0array[1]);
if( j0array[0] > IKPI )
{
    j0array[0]-=IK2PI;
}
else if( j0array[0] < -IKPI )
{    j0array[0]+=IK2PI;
}
j0valid[0] = true;
if( j0array[1] > IKPI )
{
    j0array[1]-=IK2PI;
}
else if( j0array[1] < -IKPI )
{    j0array[1]+=IK2PI;
}
j0valid[1] = true;
for(int ij0 = 0; ij0 < 2; ++ij0)
{
if( !j0valid[ij0] )
{
    continue;
}
_ij0[0] = ij0; _ij0[1] = -1;
for(int iij0 = ij0+1; iij0 < 2; ++iij0)
{
if( j0valid[iij0] && IKabs(cj0array[ij0]-cj0array[iij0]) < IKFAST_SOLUTION_THRESH && IKabs(sj0array[ij0]-sj0array[iij0]) < IKFAST_SOLUTION_THRESH )
{
    j0valid[iij0]=false; _ij0[1] = iij0; break; 
}
}
j0 = j0array[ij0]; cj0 = cj0array[ij0]; sj0 = sj0array[ij0];

{
IkReal j2array[2], cj2array[2], sj2array[2];
bool j2valid[2]={false};
_nj2 = 2;
if( (((1.00885361500683)+(((0.2164457444769)*cj0*px))+(((0.2164457444769)*py*sj0))+(((-4.328914889538)*pp)))) < -1-IKFAST_SINCOS_THRESH || (((1.00885361500683)+(((0.2164457444769)*cj0*px))+(((0.2164457444769)*py*sj0))+(((-4.328914889538)*pp)))) > 1+IKFAST_SINCOS_THRESH )
    continue;
IkReal x59=IKasin(((1.00885361500683)+(((0.2164457444769)*cj0*px))+(((0.2164457444769)*py*sj0))+(((-4.328914889538)*pp))));
j2array[0]=((-1.47519820813106)+(((-1.0)*x59)));
sj2array[0]=IKsin(j2array[0]);
cj2array[0]=IKcos(j2array[0]);
j2array[1]=((1.66639444545874)+x59);
sj2array[1]=IKsin(j2array[1]);
cj2array[1]=IKcos(j2array[1]);
if( j2array[0] > IKPI )
{
    j2array[0]-=IK2PI;
}
else if( j2array[0] < -IKPI )
{    j2array[0]+=IK2PI;
}
j2valid[0] = true;
if( j2array[1] > IKPI )
{
    j2array[1]-=IK2PI;
}
else if( j2array[1] < -IKPI )
{    j2array[1]+=IK2PI;
}
j2valid[1] = true;
for(int ij2 = 0; ij2 < 2; ++ij2)
{
if( !j2valid[ij2] )
{
    continue;
}
_ij2[0] = ij2; _ij2[1] = -1;
for(int iij2 = ij2+1; iij2 < 2; ++iij2)
{
if( j2valid[iij2] && IKabs(cj2array[ij2]-cj2array[iij2]) < IKFAST_SOLUTION_THRESH && IKabs(sj2array[ij2]-sj2array[iij2]) < IKFAST_SOLUTION_THRESH )
{
    j2valid[iij2]=false; _ij2[1] = iij2; break; 
}
}
j2 = j2array[ij2]; cj2 = cj2array[ij2]; sj2 = sj2array[ij2];

{
IkReal j1eval[3];
IkReal x60=cj2*cj2;
IkReal x61=(cj2*pz);
IkReal x62=(cj0*px);
IkReal x63=(cj2*sj2);
IkReal x64=((0.365)*sj2);
IkReal x65=(py*sj0);
IkReal x66=((0.035)*cj2);
IkReal x67=((417.142857142857)*sj2);
IkReal x68=(pz*sj2);
IkReal x69=((40.0)*cj2);
j1eval[0]=((((360.0)*pz))+cj2+((x62*x67))+(((-10.4285714285714)*sj2))+(((417.142857142857)*x61))+(((-1.0)*x65*x69))+(((40.0)*x68))+(((-1.0)*x62*x69))+((x65*x67)));
j1eval[1]=((IKabs(((0.012775)+(((0.132)*x63))+(((-0.011025)*cj2))+(((-0.02555)*x60))+((pz*x65))+((pz*x62))+(((0.114975)*sj2))+(((-0.025)*pz)))))+(IKabs(((-0.133225)+(((0.132)*x60))+(pz*pz)+(((0.02555)*x63))))));
j1eval[2]=IKsign(((((-0.009125)*sj2))+(((0.035)*x68))+((x62*x64))+(((-1.0)*x65*x66))+(((0.315)*pz))+(((0.365)*x61))+((x64*x65))+(((0.000875)*cj2))+(((-1.0)*x62*x66))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  || IKabs(j1eval[2]) < 0.0000010000000000  )
{
{
IkReal j1eval[2];
IkReal x70=(cj0*px);
IkReal x71=(pz*sj2);
IkReal x72=(cj2*pz);
IkReal x73=(py*sj0);
IkReal x74=((417.142857142857)*cj2);
IkReal x75=((0.365)*cj2);
IkReal x76=(sj2*x73);
j1eval[0]=((9.0)+(((-360.0)*x73))+(((-360.0)*x70))+(((417.142857142857)*x71))+sj2+(((-1.0)*x70*x74))+(((10.4285714285714)*cj2))+(((-40.0)*x76))+(((-40.0)*x72))+(((-1.0)*x73*x74))+(((-40.0)*sj2*x70)));
j1eval[1]=IKsign(((0.007875)+(((0.009125)*cj2))+(((-1.0)*x70*x75))+(((-0.035)*x72))+(((-0.035)*x76))+(((0.365)*x71))+(((0.000875)*sj2))+(((-1.0)*x73*x75))+(((-0.315)*x70))+(((-0.315)*x73))+(((-0.035)*sj2*x70))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  )
{
{
IkReal j1eval[2];
IkReal x77=cj0*cj0;
IkReal x78=py*py;
IkReal x79=px*px;
IkReal x80=pz*pz;
IkReal x81=(cj0*px);
IkReal x82=(py*sj0);
IkReal x83=((1600.0)*x78);
IkReal x84=(x77*x79);
j1eval[0]=((-1.0)+((x77*x83))+(((80.0)*x81))+(((80.0)*x82))+(((-1600.0)*x80))+(((-1600.0)*x84))+(((-3200.0)*x81*x82))+(((-1.0)*x83)));
j1eval[1]=IKsign(((-0.000625)+(((0.05)*x82))+(((0.05)*x81))+(((-2.0)*x81*x82))+(((-1.0)*x84))+(((-1.0)*x80))+(((-1.0)*x78))+((x77*x78))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  )
{
continue; // no branches [j1]

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x85=py*py;
IkReal x86=cj0*cj0;
IkReal x87=(py*sj0);
IkReal x88=((0.365)*cj2);
IkReal x89=((0.035)*sj2);
IkReal x90=((0.365)*sj2);
IkReal x91=(cj0*px);
IkReal x92=((0.035)*cj2);
CheckValue<IkReal> x93=IKPowWithIntegerCheck(IKsign(((-0.000625)+(((0.05)*x87))+(((0.05)*x91))+(((-1.0)*x86*(px*px)))+((x85*x86))+(((-2.0)*x87*x91))+(((-1.0)*x85))+(((-1.0)*(pz*pz))))),-1);
if(!x93.valid){
continue;
}
CheckValue<IkReal> x94 = IKatan2WithCheck(IkReal(((((-0.009125)*sj2))+((x87*x90))+(((-1.0)*x91*x92))+(((-1.0)*x87*x92))+(((-0.315)*pz))+((x90*x91))+(((-1.0)*pz*x88))+(((-1.0)*pz*x89))+(((0.000875)*cj2)))),IkReal(((0.007875)+(((0.009125)*cj2))+(((-1.0)*pz*x90))+((pz*x92))+(((-1.0)*x87*x88))+(((-1.0)*x87*x89))+(((0.000875)*sj2))+(((-0.315)*x87))+(((-1.0)*x88*x91))+(((-0.315)*x91))+(((-1.0)*x89*x91)))),IKFAST_ATAN2_MAGTHRESH);
if(!x94.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(((1.5707963267949)*(x93.value)))+(x94.value));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x95=IKsin(j1);
IkReal x96=IKcos(j1);
IkReal x97=((0.365)*cj2);
IkReal x98=((0.035)*sj2);
IkReal x99=((0.365)*sj2);
IkReal x100=(py*sj0);
IkReal x101=((1.0)*pz);
IkReal x102=((0.035)*cj2);
IkReal x103=(cj0*px);
IkReal x104=((1.0)*x96);
IkReal x105=(x103*x96);
evalcond[0]=(((x100*x95))+((x103*x95))+(((-1.0)*x102))+(((-0.025)*x95))+x99+(((-1.0)*x101*x96)));
evalcond[1]=((0.315)+(((-1.0)*x100*x104))+(((0.025)*x96))+x98+x97+(((-1.0)*x101*x95))+(((-1.0)*x103*x104)));
evalcond[2]=(((x96*x99))+(((-1.0)*x102*x96))+(((-1.0)*x101))+(((0.315)*x95))+((x95*x97))+((x95*x98)));
evalcond[3]=((0.0346)+(((0.63)*x105))+(((-1.0)*pp))+(((-0.01575)*x96))+(((0.63)*pz*x95))+(((0.63)*x100*x96))+(((0.05)*x103))+(((0.05)*x100)));
evalcond[4]=((0.025)+(((-1.0)*x95*x99))+((x96*x97))+((x96*x98))+((x102*x95))+(((0.315)*x96))+(((-1.0)*x103))+(((-1.0)*x100)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x608=cj2*cj2;
IkReal x609=(py*sj0);
IkReal x610=((0.365)*cj2);
IkReal x611=((0.035)*sj2);
IkReal x612=(cj2*sj2);
IkReal x613=(cj0*px);
IkReal x614=((1.0)*pz);
CheckValue<IkReal> x615=IKPowWithIntegerCheck(IKsign(((0.007875)+(((0.009125)*cj2))+(((-0.035)*cj2*pz))+(((-1.0)*x610*x613))+(((-1.0)*x609*x611))+(((-1.0)*x609*x610))+(((-1.0)*x611*x613))+(((0.365)*pz*sj2))+(((0.000875)*sj2))+(((-0.315)*x609))+(((-0.315)*x613)))),-1);
if(!x615.valid){
continue;
}
CheckValue<IkReal> x616 = IKatan2WithCheck(IkReal(((0.012775)+(((0.025)*pz))+(((-1.0)*x609*x614))+(((-0.02555)*x608))+(((-0.011025)*cj2))+(((-1.0)*x613*x614))+(((0.132)*x612))+(((0.114975)*sj2)))),IkReal(((-0.10045)+(pz*pz)+(((-0.02555)*x612))+(((-0.02205)*sj2))+(((-0.132)*x608))+(((-0.22995)*cj2)))),IKFAST_ATAN2_MAGTHRESH);
if(!x616.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(((1.5707963267949)*(x615.value)))+(x616.value));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x617=IKsin(j1);
IkReal x618=IKcos(j1);
IkReal x619=((0.365)*cj2);
IkReal x620=((0.035)*sj2);
IkReal x621=((0.365)*sj2);
IkReal x622=(py*sj0);
IkReal x623=((1.0)*pz);
IkReal x624=((0.035)*cj2);
IkReal x625=(cj0*px);
IkReal x626=((1.0)*x618);
IkReal x627=(x618*x625);
evalcond[0]=(((x617*x625))+((x617*x622))+(((-1.0)*x624))+(((-0.025)*x617))+x621+(((-1.0)*x618*x623)));
evalcond[1]=((0.315)+(((0.025)*x618))+(((-1.0)*x622*x626))+(((-1.0)*x617*x623))+(((-1.0)*x625*x626))+x619+x620);
evalcond[2]=(((x617*x620))+(((-1.0)*x623))+((x618*x621))+((x617*x619))+(((0.315)*x617))+(((-1.0)*x618*x624)));
evalcond[3]=((0.0346)+(((0.63)*x618*x622))+(((0.05)*x625))+(((0.05)*x622))+(((0.63)*pz*x617))+(((-1.0)*pp))+(((0.63)*x627))+(((-0.01575)*x618)));
evalcond[4]=((0.025)+((x617*x624))+((x618*x620))+(((-1.0)*x617*x621))+(((-1.0)*x622))+(((-1.0)*x625))+(((0.315)*x618))+((x618*x619)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x628=cj2*cj2;
IkReal x629=(cj2*sj2);
IkReal x630=((0.365)*sj2);
IkReal x631=(py*sj0);
IkReal x632=(cj0*px);
IkReal x633=((0.035)*cj2);
CheckValue<IkReal> x634 = IKatan2WithCheck(IkReal(((-0.133225)+(((0.132)*x628))+(pz*pz)+(((0.02555)*x629)))),IkReal(((0.012775)+(((-0.02555)*x628))+((pz*x631))+((pz*x632))+(((0.132)*x629))+(((-0.011025)*cj2))+(((0.114975)*sj2))+(((-0.025)*pz)))),IKFAST_ATAN2_MAGTHRESH);
if(!x634.valid){
continue;
}
CheckValue<IkReal> x635=IKPowWithIntegerCheck(IKsign(((((-0.009125)*sj2))+(((-1.0)*x631*x633))+(((0.315)*pz))+((x630*x632))+((x630*x631))+(((0.035)*pz*sj2))+(((0.365)*cj2*pz))+(((0.000875)*cj2))+(((-1.0)*x632*x633)))),-1);
if(!x635.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(x634.value)+(((1.5707963267949)*(x635.value))));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x636=IKsin(j1);
IkReal x637=IKcos(j1);
IkReal x638=((0.365)*cj2);
IkReal x639=((0.035)*sj2);
IkReal x640=((0.365)*sj2);
IkReal x641=(py*sj0);
IkReal x642=((1.0)*pz);
IkReal x643=((0.035)*cj2);
IkReal x644=(cj0*px);
IkReal x645=((1.0)*x637);
IkReal x646=(x637*x644);
evalcond[0]=(((x636*x644))+((x636*x641))+(((-0.025)*x636))+(((-1.0)*x643))+x640+(((-1.0)*x637*x642)));
evalcond[1]=((0.315)+(((-1.0)*x641*x645))+(((0.025)*x637))+(((-1.0)*x644*x645))+x638+x639+(((-1.0)*x636*x642)));
evalcond[2]=((((0.315)*x636))+((x636*x639))+((x636*x638))+((x637*x640))+(((-1.0)*x642))+(((-1.0)*x637*x643)));
evalcond[3]=((0.0346)+(((-0.01575)*x637))+(((0.63)*x637*x641))+(((-1.0)*pp))+(((0.05)*x641))+(((0.05)*x644))+(((0.63)*x646))+(((0.63)*pz*x636)));
evalcond[4]=((0.025)+(((-1.0)*x641))+(((-1.0)*x644))+((x636*x643))+(((0.315)*x637))+(((-1.0)*x636*x640))+((x637*x639))+((x637*x638)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}
}
}
}
}

}

}
}
return solutions.GetNumSolutions()>0;
}